

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::StickyAdapter::makeSticky
          (StickyAdapter *this,RealType w0,RealType v0,RealType v0p,RealType rl,RealType ru,
          RealType rlp,RealType rup,bool isPower)

{
  AtomType *this_00;
  bool bVar1;
  StickyAtypeParameters stickyParam;
  undefined1 local_b9;
  SimpleTypeData<OpenMD::StickyAtypeParameters> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  RealType local_80;
  RealType local_78;
  RealType local_70;
  shared_ptr<OpenMD::GenericData> local_68;
  StickyAtypeParameters local_58;
  
  local_a0 = w0;
  local_98 = v0;
  local_90 = v0p;
  local_88 = rl;
  local_80 = ru;
  local_78 = rlp;
  local_70 = rup;
  bVar1 = AtomType::hasProperty(this->at_,(string *)StickyTypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)StickyTypeID_abi_cxx11_);
  }
  local_58.w0 = local_a0;
  local_58.v0 = local_98;
  local_58.v0p = local_90;
  local_58.rl = local_88;
  local_58.ru = local_80;
  local_58.rlp = local_78;
  local_58.rup = local_70;
  local_58._57_7_ = 0;
  local_58.isPower = isPower;
  this_00 = this->at_;
  local_b8 = (SimpleTypeData<OpenMD::StickyAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>>,std::__cxx11::string_const&,OpenMD::StickyAtypeParameters&>
            (a_Stack_b0,&local_b8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::StickyAtypeParameters>_> *)&local_b9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             StickyTypeID_abi_cxx11_,&local_58);
  local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_GenericData;
  local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_b0[0]._M_pi;
  local_b8 = (SimpleTypeData<OpenMD::StickyAtypeParameters> *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  return;
}

Assistant:

void StickyAdapter::makeSticky(RealType w0, RealType v0, RealType v0p,
                                 RealType rl, RealType ru, RealType rlp,
                                 RealType rup, bool isPower) {
    if (isSticky()) { at_->removeProperty(StickyTypeID); }

    StickyAtypeParameters stickyParam {};
    stickyParam.w0      = w0;
    stickyParam.v0      = v0;
    stickyParam.v0p     = v0p;
    stickyParam.rl      = rl;
    stickyParam.ru      = ru;
    stickyParam.rlp     = rlp;
    stickyParam.rup     = rup;
    stickyParam.isPower = isPower;

    at_->addProperty(
        std::make_shared<StickyAtypeData>(StickyTypeID, stickyParam));
  }